

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O0

bool Qt::mightBeRichText(QAnyStringView text)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  anon_class_1_0_00000001 *in_stack_00000020;
  QAnyStringView *in_stack_00000028;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = QAnyStringView::visit<Qt::mightBeRichText(QAnyStringView)::__0>
                    (in_stack_00000028,in_stack_00000020);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool Qt::mightBeRichText(QAnyStringView text)
{
    return text.visit([](auto text) { return mightBeRichTextImpl(text); });
}